

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_safecopyDstBeforeSrc(BYTE *op,BYTE *ip,ptrdiff_t length)

{
  undefined1 *puVar1;
  long in_RDX;
  undefined1 *in_RSI;
  undefined1 *in_RDI;
  BYTE *oend;
  ptrdiff_t diff;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_1;
  ptrdiff_t diff_1;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_38;
  undefined1 *local_30;
  
  puVar1 = in_RDI + in_RDX;
  local_50 = in_RSI;
  local_48 = in_RDI;
  if ((in_RDX < 8) || (-8 < (long)in_RDI - (long)in_RSI)) {
    while (local_48 < puVar1) {
      *local_48 = *local_50;
      local_50 = local_50 + 1;
      local_48 = local_48 + 1;
    }
  }
  else {
    if ((in_RDI <= puVar1 + -0x20) && ((long)in_RDI - (long)in_RSI < -0x10)) {
      if (((long)in_RDI - (long)in_RSI < 0x10) && (-0x10 < (long)in_RDI - (long)in_RSI)) {
        __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x36a6,
                      "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
      }
      ZSTD_copy16(in_RDI,in_RSI);
      if (0x10 < (long)(puVar1 + (-0x20 - (long)in_RDI))) {
        local_38 = in_RDI + 0x10;
        local_30 = in_RSI + 0x10;
        do {
          ZSTD_copy16(local_38,local_30);
          ZSTD_copy16(local_38 + 0x10,local_30 + 0x10);
          local_38 = local_38 + 0x20;
          local_30 = local_30 + 0x20;
        } while (local_38 < in_RDI + (long)(puVar1 + (-0x20 - (long)in_RDI)));
      }
      local_50 = in_RSI + (long)(puVar1 + (-0x20 - (long)in_RDI));
      local_48 = puVar1 + -0x20;
    }
    while (local_48 < puVar1) {
      *local_48 = *local_50;
      local_50 = local_50 + 1;
      local_48 = local_48 + 1;
    }
  }
  return;
}

Assistant:

static void ZSTD_safecopyDstBeforeSrc(BYTE* op, BYTE const* ip, ptrdiff_t length) {
    ptrdiff_t const diff = op - ip;
    BYTE* const oend = op + length;

    if (length < 8 || diff > -8) {
        /* Handle short lengths, close overlaps, and dst not before src. */
        while (op < oend) *op++ = *ip++;
        return;
    }

    if (op <= oend - WILDCOPY_OVERLENGTH && diff < -WILDCOPY_VECLEN) {
        ZSTD_wildcopy(op, ip, oend - WILDCOPY_OVERLENGTH - op, ZSTD_no_overlap);
        ip += oend - WILDCOPY_OVERLENGTH - op;
        op += oend - WILDCOPY_OVERLENGTH - op;
    }

    /* Handle the leftovers. */
    while (op < oend) *op++ = *ip++;
}